

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::unexpected(Parser *this)

{
  ostream *poVar1;
  ParseException *this_00;
  Token *pTVar2;
  char *local_250;
  _Alloc_hider local_248;
  undefined1 local_218 [56];
  undefined1 local_1e0 [56];
  stringstream msg;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_198,"Unexpected \'");
  pTVar2 = &this->currentToken;
  Token::Token((Token *)&local_250,pTVar2);
  poVar1 = std::operator<<(poVar1,local_248._M_p);
  poVar1 = std::operator<<(poVar1,"\' on line ");
  Token::Token((Token *)local_1e0,pTVar2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," column ");
  Token::Token((Token *)local_218,pTVar2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::string::~string((string *)(local_218 + 8));
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string((string *)&local_248);
  this_00 = (ParseException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParseException::ParseException(this_00,local_250);
  __cxa_throw(this_00,&ParseException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::unexpected() {
    std::stringstream msg;
    msg << "Unexpected '" << token().lexeme.c_str() << "' on line " << token().line << " column " << token().col;
    throw ParseException(msg.str().c_str());
}